

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<TFad<6,_double>_>::AddKel
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  int64_t iVar5;
  int iVar6;
  TFad<6,_double> *pTVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  lVar1 = source->fNElements;
  local_b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_b0.val_ = 0.0;
  local_b0.dx_[0] = 0.0;
  local_b0.dx_[1] = 0.0;
  local_b0.dx_[2] = 0.0;
  local_b0.dx_[3] = 0.0;
  local_b0.dx_[4] = 0.0;
  local_b0.dx_[5] = 0.0;
  iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  lVar8 = 0;
  if (0 < lVar1) {
    lVar8 = lVar1;
  }
  if (iVar6 == 0) {
    for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar2 = destinationindex->fStore[lVar10];
      iVar3 = source->fStore[lVar10];
      for (lVar9 = 0; lVar1 != lVar9; lVar9 = lVar9 + 1) {
        lVar4 = destinationindex->fStore[lVar9];
        iVar5 = source->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_70,this,lVar2,lVar4);
        TFad<6,_double>::operator=(&local_b0,&local_70);
        pTVar7 = TPZFMatrix<TFad<6,_double>_>::operator()(elmat,iVar3,iVar5);
        TFad<6,_double>::operator+=(&local_b0,pTVar7);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_b0);
      }
    }
  }
  else {
    for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar2 = destinationindex->fStore[lVar10];
      iVar3 = source->fStore[lVar10];
      for (lVar9 = lVar10; lVar1 != lVar9; lVar9 = lVar9 + 1) {
        lVar4 = destinationindex->fStore[lVar9];
        iVar5 = source->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_70,this,lVar2,lVar4);
        TFad<6,_double>::operator=(&local_b0,&local_70);
        pTVar7 = TPZFMatrix<TFad<6,_double>_>::operator()(elmat,iVar3,iVar5);
        TFad<6,_double>::operator+=(&local_b0,pTVar7);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_b0);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}